

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O3

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,uint8_t *a)

{
  uint8_t uVar1;
  char *__nptr;
  string *psVar3;
  int iVar2;
  
  if (c == '1') {
    __nptr = zmsg_popstr(this->msg);
    if (__nptr == (char *)0x0) {
      uVar1 = '\0';
    }
    else {
      iVar2 = atoi(__nptr);
      uVar1 = (uint8_t)iVar2;
    }
    *a = uVar1;
    free(__nptr);
    return;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar3,"Could not read message. Expected different type, got uint8_t","");
  __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, uint8_t &a){
    if(c != '1') throw std::string(PROCESSERROR "uint8_t");
    char *str = zmsg_popstr(msg);
    a = str ? (uint8_t)atoi(str) : 0;
    freen(str);
}